

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_compat.c
# Opt level: O3

int SZ_BufftoBuffCompress(void *dest,size_t *destLen,void *source,size_t sourceLen,SZ_com_t *param)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  void *__ptr;
  void *__ptr_00;
  ulong uVar5;
  sbyte sVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  size_t __n;
  uint *__src;
  size_t __size;
  ulong uVar11;
  ulong uVar12;
  size_t sVar13;
  uint uVar14;
  bool bVar15;
  bool bVar16;
  aec_stream strm;
  char zero_pixel [4];
  void *local_2d8;
  void *local_280;
  size_t local_278;
  void *local_268;
  size_t local_260;
  size_t local_258;
  uint local_250;
  int local_24c;
  int local_248;
  uint local_244;
  uint local_238 [16];
  undefined4 local_1f8;
  undefined4 local_1b8;
  
  iVar10 = param->pixels_per_block;
  iVar4 = param->pixels_per_scanline;
  iVar2 = (iVar4 + iVar10 + -1) / iVar10;
  uVar14 = param->options_mask;
  local_24c = iVar10;
  local_248 = iVar2;
  memset(local_238,0,0x204);
  uVar8 = 0;
  local_1f8 = 4;
  local_1b8 = 8;
  uVar3 = 1;
  do {
    if ((uVar3 & uVar14) != 0) {
      uVar8 = uVar8 | local_238[(int)uVar3];
    }
    uVar3 = uVar3 * 2;
  } while ((int)uVar3 < 0x81);
  local_244 = uVar8 | 0x40;
  local_260 = *destLen;
  uVar14 = param->bits_per_pixel;
  bVar15 = uVar14 == 0x40;
  bVar16 = uVar14 == 0x20;
  local_268 = dest;
  if ((uVar14 == 0x40) || (__ptr = source, local_250 = uVar14, uVar14 == 0x20)) {
    local_250 = 8;
    __ptr = malloc(sourceLen);
    if (__ptr == (void *)0x0) {
      return -4;
    }
    uVar5 = (ulong)(uVar14 >> 3);
    uVar14 = 8;
    if (uVar5 <= sourceLen) {
      uVar9 = 0;
      do {
        uVar11 = 0;
        do {
          *(undefined1 *)((long)__ptr + uVar11 * (sourceLen / uVar5) + uVar9) =
               *(undefined1 *)((long)source + uVar11);
          uVar11 = uVar11 + 1;
        } while (uVar5 != uVar11);
        uVar9 = uVar9 + 1;
        source = (void *)((long)source + uVar5);
      } while (uVar9 < sourceLen / uVar5);
    }
  }
  __n = 4;
  if ((int)uVar14 < 0x11) {
    __n = (ulong)(8 < (int)uVar14) + 1;
  }
  sVar6 = 2;
  if ((int)uVar14 < 0x11) {
    sVar6 = 8 < (int)uVar14;
  }
  iVar2 = iVar2 * iVar10;
  __size = (ulong)(uint)(iVar2 << sVar6) *
           ((((sourceLen >> sVar6) + (long)iVar4) - 1) / (ulong)(long)iVar4);
  __ptr_00 = malloc(__size);
  if (__ptr_00 == (void *)0x0) {
    iVar10 = -4;
  }
  else {
    local_238[0] = 0;
    __src = local_238;
    if (sourceLen != 0) {
      uVar5 = (ulong)(iVar4 << sVar6);
      sVar13 = (uint)(iVar2 - iVar4 << sVar6) + uVar5;
      uVar9 = 0;
      lVar7 = 0;
      local_2d8 = __ptr_00;
      do {
        uVar11 = sourceLen - uVar9;
        if (uVar5 <= sourceLen - uVar9) {
          uVar11 = uVar5;
        }
        memcpy((void *)((long)__ptr_00 + lVar7),(void *)((long)__ptr + uVar9),uVar11);
        uVar9 = uVar9 + uVar11;
        puVar1 = (uint *)((long)__ptr + (uVar9 - __n));
        if ((uVar8 & 8) == 0) {
          puVar1 = __src;
        }
        __src = puVar1;
        if (sVar13 != uVar11) {
          uVar12 = 0;
          do {
            memcpy((void *)((long)local_2d8 + uVar12 + uVar11),__src,__n);
            uVar12 = uVar12 + __n;
          } while (uVar12 < sVar13 - uVar11);
        }
        lVar7 = lVar7 + sVar13;
        local_2d8 = (void *)((long)local_2d8 + sVar13);
      } while (uVar9 < sourceLen);
    }
    local_280 = __ptr_00;
    local_278 = __size;
    iVar4 = aec_buffer_encode(&local_280);
    *destLen = local_258;
    iVar10 = 2;
    if (iVar4 != -2) {
      iVar10 = iVar4;
    }
    free(__ptr_00);
  }
  if ((bVar16 || bVar15) && __ptr != (void *)0x0) {
    free(__ptr);
  }
  return iVar10;
}

Assistant:

int SZ_BufftoBuffCompress(void *dest, size_t *destLen,
                          const void *source, size_t sourceLen,
                          SZ_com_t *param)
{
    struct aec_stream strm;
    int status;
    int aec_status;
    void *padbuf;
    void *buf;
    size_t padding_size;
    size_t scanlines;
    size_t padbuf_size;
    int pixel_size;
    int interleave;

    strm.block_size = param->pixels_per_block;
    strm.rsi = (param->pixels_per_scanline + param->pixels_per_block - 1)
        / param->pixels_per_block;
    strm.flags = AEC_NOT_ENFORCE | convert_options(param->options_mask);
    strm.avail_out = *destLen;
    strm.next_out = dest;
    buf = 0;
    padbuf = 0;

    interleave = param->bits_per_pixel == 32 || param->bits_per_pixel == 64;
    if (interleave) {
        strm.bits_per_sample = 8;
        buf = malloc(sourceLen);
        if (buf == NULL) {
            status = SZ_MEM_ERROR;
            goto CLEANUP;
        }
        interleave_buffer(buf, source, sourceLen, param->bits_per_pixel / 8);
    } else {
        strm.bits_per_sample = param->bits_per_pixel;
        buf = (void *)source;
    }

    pixel_size = bits_to_bytes(strm.bits_per_sample);

    scanlines = (sourceLen / pixel_size + param->pixels_per_scanline - 1)
        / param->pixels_per_scanline;
    padbuf_size = strm.rsi * strm.block_size * pixel_size * scanlines;
    padbuf = malloc(padbuf_size);
    if (padbuf == NULL) {
        status = SZ_MEM_ERROR;
        goto CLEANUP;
    }

    padding_size =
        (strm.rsi * strm.block_size - param->pixels_per_scanline)
        * pixel_size;

    add_padding(padbuf, buf, sourceLen,
                param->pixels_per_scanline * pixel_size,
                padding_size, pixel_size,
                strm.flags & AEC_DATA_PREPROCESS);
    strm.next_in = padbuf;
    strm.avail_in = padbuf_size;

    aec_status = aec_buffer_encode(&strm);
    if (aec_status == AEC_STREAM_ERROR)
        status = SZ_OUTBUFF_FULL;
    else
        status = aec_status;
    *destLen = strm.total_out;

CLEANUP:
    if (padbuf)
        free(padbuf);
    if (interleave && buf)
        free(buf);
    return status;
}